

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmetaobject.cpp
# Opt level: O1

ssize_t __thiscall
QDBusMetaObjectGenerator::write(QDBusMetaObjectGenerator *this,int __fd,void *__buf,size_t __n)

{
  undefined4 *puVar1;
  size_t __n_00;
  MethodMap *map;
  QMapData<std::map<QByteArray,_QDBusMetaObjectGenerator::Method,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QDBusMetaObjectGenerator::Method>_>_>_>
  *pQVar2;
  QMapData<std::map<QByteArray,_QDBusMetaObjectGenerator::Method,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QDBusMetaObjectGenerator::Method>_>_>_>
  *pQVar3;
  QMapData<std::map<QByteArray,_QDBusMetaObjectGenerator::Property,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QDBusMetaObjectGenerator::Property>_>_>_>
  *pQVar4;
  undefined4 uVar5;
  _Rb_tree_color _Var6;
  _Rb_tree_color _Var7;
  qsizetype qVar8;
  qsizetype qVar9;
  _Rb_tree_node_base *p_Var10;
  void *__s;
  long lVar11;
  void *pvVar12;
  void *__dest;
  int iVar13;
  size_t sVar14;
  _Base_ptr p_Var15;
  int iVar16;
  size_t sVar17;
  long lVar18;
  long lVar19;
  _Rb_tree_node_base *p_Var20;
  long lVar21;
  long lVar22;
  int iVar23;
  undefined4 in_register_00000034;
  undefined8 *puVar24;
  char *pcVar25;
  ulong uVar26;
  long lVar27;
  ulong asize;
  undefined1 *puVar28;
  _Base_ptr p_Var29;
  long in_FS_OFFSET;
  QLatin1String QVar30;
  QLatin1String QVar31;
  QMetaStringTable strings;
  QVarLengthArray<unsigned_int,_256LL> idata;
  long local_530;
  long local_528;
  long local_520;
  QMetaType local_4e0;
  QString local_4d8;
  QByteArray local_4b8;
  undefined1 *puStack_4a0;
  undefined1 *local_498;
  QString local_488;
  QDBusMetaObjectGenerator *local_468;
  MethodMap *pMStack_460;
  QVLABase<unsigned_int> local_450;
  undefined8 local_438 [128];
  long local_38;
  
  puVar24 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_488.d.d = (this->interface).d.d;
  local_488.d.ptr = (this->interface).d.ptr;
  local_488.d.size = (this->interface).d.size;
  if (&(local_488.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_488.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_488.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar30.m_data = (char *)0x2;
  QVar30.m_size = 0x2e;
  QString::replace((QChar)(char16_t)&local_488,QVar30,0x19992f);
  if (local_488.d.size == 0) {
    QVar31.m_data = "QDBusInterface";
    QVar31.m_size = 0xe;
    QString::operator=(&local_488,QVar31);
  }
  memset(&local_450,0xaa,0x418);
  local_450.super_QVLABaseBase.a = 0x100;
  local_450.super_QVLABaseBase.s = 0;
  local_450.super_QVLABaseBase.ptr = local_438;
  QVLABase<unsigned_int>::reallocate_impl(&local_450,0x100,local_438,0x10,0x100);
  local_450.super_QVLABaseBase.s = 0x10;
  qVar8 = aggregateParameterCount(&this->signals_);
  map = &this->methods;
  qVar9 = aggregateParameterCount(map);
  pvVar12 = local_450.super_QVLABaseBase.ptr;
  pQVar2 = (this->signals_).d.d.ptr;
  if (pQVar2 == (QMapData<std::map<QByteArray,_QDBusMetaObjectGenerator::Method,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QDBusMetaObjectGenerator::Method>_>_>_>
                 *)0x0) {
    sVar17 = 0;
  }
  else {
    sVar17 = *(size_t *)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header + 0x20);
  }
  pQVar3 = (map->d).d.ptr;
  if (pQVar3 == (QMapData<std::map<QByteArray,_QDBusMetaObjectGenerator::Method,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QDBusMetaObjectGenerator::Method>_>_>_>
                 *)0x0) {
    sVar14 = 0;
  }
  else {
    sVar14 = (pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  *(undefined8 *)local_450.super_QVLABaseBase.ptr = 0xd;
  *(undefined8 *)((long)pvVar12 + 8) = 0;
  if (pQVar2 == (QMapData<std::map<QByteArray,_QDBusMetaObjectGenerator::Method,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QDBusMetaObjectGenerator::Method>_>_>_>
                 *)0x0) {
    iVar16 = 0;
  }
  else {
    iVar16 = (int)*(size_t *)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header + 0x20);
  }
  iVar13 = 0;
  if (pQVar3 == (QMapData<std::map<QByteArray,_QDBusMetaObjectGenerator::Method,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QDBusMetaObjectGenerator::Method>_>_>_>
                 *)0x0) {
    iVar23 = 0;
  }
  else {
    iVar23 = (int)(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  iVar23 = iVar23 + iVar16;
  lVar22 = (qVar9 + qVar8) * 2 - (sVar17 + sVar14);
  *(int *)((long)pvVar12 + 0x10) = iVar23;
  *(undefined4 *)((long)pvVar12 + 0x14) = 0x10;
  pQVar4 = (this->properties).d.d.ptr;
  if (pQVar4 != (QMapData<std::map<QByteArray,_QDBusMetaObjectGenerator::Property,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QDBusMetaObjectGenerator::Property>_>_>_>
                 *)0x0) {
    iVar13 = (int)(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  *(int *)((long)pvVar12 + 0x18) = iVar13;
  iVar16 = (int)lVar22 + iVar23 * 6 + 0x10;
  *(int *)((long)pvVar12 + 0x1c) = iVar16;
  *(undefined8 *)((long)pvVar12 + 0x20) = 0;
  *(undefined8 *)((long)pvVar12 + 0x28) = 0;
  *(undefined4 *)((long)pvVar12 + 0x30) = 10;
  if (pQVar2 == (QMapData<std::map<QByteArray,_QDBusMetaObjectGenerator::Method,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QDBusMetaObjectGenerator::Method>_>_>_>
                 *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(undefined4 *)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header + 0x20);
  }
  *(undefined4 *)((long)pvVar12 + 0x34) = uVar5;
  iVar16 = iVar13 * 5 + iVar16;
  *(int *)((long)pvVar12 + 0x38) = iVar16;
  *(int *)((long)pvVar12 + 0x3c) = iVar16 + iVar13 * 2;
  lVar27 = (long)iVar13 * 7 + lVar22 + (long)iVar23 * 8 + 0x10;
  local_468 = this;
  pMStack_460 = map;
  lVar18 = 0;
  do {
    lVar19 = **(long **)((long)&local_468 + lVar18);
    if (lVar19 == 0) {
      p_Var10 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var10 = *(_Rb_tree_node_base **)(lVar19 + 0x20);
    }
    p_Var20 = (_Rb_tree_node_base *)(lVar19 + 0x10);
    if (lVar19 == 0) {
      p_Var20 = (_Rb_tree_node_base *)0x0;
    }
    for (; p_Var10 != p_Var20; p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
      lVar27 = (long)&(p_Var10[5]._M_left)->_M_color +
               (long)&(p_Var10[4]._M_parent)->_M_color + lVar27 + 2;
    }
    lVar18 = lVar18 + 8;
  } while (lVar18 != 0x10);
  asize = lVar27 + 1;
  uVar26 = local_450.super_QVLABaseBase.a;
  if (local_450.super_QVLABaseBase.a <= (long)asize) {
    uVar26 = asize;
  }
  QVLABase<unsigned_int>::reallocate_impl(&local_450,0x100,local_438,asize,uVar26);
  local_498 = &DAT_aaaaaaaaaaaaaaaa;
  local_4b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  puStack_4a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_4b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_4b8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_450.super_QVLABaseBase.s = asize;
  QString::toLatin1_helper(&local_4d8);
  QMetaStringTable::QMetaStringTable((QMetaStringTable *)&local_4b8,(QByteArray *)&local_4d8);
  if (&(local_4d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_4d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_4d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_4d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_4d8.d.d)->super_QArrayData,1,0x10);
    }
  }
  lVar18 = (long)*(int *)((long)pvVar12 + 0x14);
  lVar27 = (long)*(int *)((long)pvVar12 + 0x10);
  local_520 = (long)*(int *)((long)pvVar12 + 0x3c);
  *(undefined4 *)((long)local_450.super_QVLABaseBase.ptr + (local_520 + lVar27 * 2) * 4) = 0;
  pQVar4 = (this->properties).d.d.ptr;
  uVar26 = 1;
  if (pQVar4 != (QMapData<std::map<QByteArray,_QDBusMetaObjectGenerator::Property,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QDBusMetaObjectGenerator::Property>_>_>_>
                 *)0x0) {
    uVar26 = (pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
  }
  lVar19 = lVar18 + lVar27 * 6;
  local_528 = local_520 + lVar27 * 2 + 1;
  lVar27 = 0;
  do {
    lVar21 = **(long **)((long)&local_468 + lVar27);
    if (lVar21 == 0) {
      p_Var10 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var10 = *(_Rb_tree_node_base **)(lVar21 + 0x20);
    }
    p_Var20 = (_Rb_tree_node_base *)(lVar21 + 0x10);
    if (lVar21 == 0) {
      p_Var20 = (_Rb_tree_node_base *)0x0;
    }
    for (; p_Var10 != p_Var20; p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
      p_Var15 = p_Var10[5]._M_left;
      if ((long)p_Var15 < 2) {
        p_Var15 = (_Base_ptr)0x1;
      }
      uVar26 = (long)&p_Var15->_M_color + (long)&(p_Var10[4]._M_parent)->_M_color + uVar26;
    }
    lVar27 = lVar27 + 8;
  } while (lVar27 != 0x10);
  __s = operator_new__(-(ulong)(uVar26 >> 0x3d != 0) | uVar26 * 8);
  if (uVar26 != 0) {
    memset(__s,0,uVar26 * 8);
  }
  local_530 = 1;
  if (pQVar4 != (QMapData<std::map<QByteArray,_QDBusMetaObjectGenerator::Property,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QDBusMetaObjectGenerator::Property>_>_>_>
                 *)0x0) {
    local_530 = (pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
  }
  lVar27 = 0;
  do {
    lVar21 = **(long **)((long)&local_468 + lVar27);
    if (lVar21 == 0) {
      p_Var10 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var10 = *(_Rb_tree_node_base **)(lVar21 + 0x20);
    }
    p_Var20 = (_Rb_tree_node_base *)(lVar21 + 0x10);
    if (lVar21 == 0) {
      p_Var20 = (_Rb_tree_node_base *)0x0;
    }
    for (; p_Var10 != p_Var20; p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
      p_Var15 = p_Var10[4]._M_parent;
      p_Var29 = p_Var10[5]._M_left;
      if ((long)p_Var29 < 2) {
        p_Var29 = (_Base_ptr)0x1;
      }
      puVar28 = (undefined1 *)((long)&p_Var15[-1]._M_right + 7) + (long)p_Var29;
      uVar5 = QMetaStringTable::enter(&local_4b8);
      *(undefined4 *)((long)local_450.super_QVLABaseBase.ptr + lVar18 * 4) = uVar5;
      *(int *)((long)local_450.super_QVLABaseBase.ptr + lVar18 * 4 + 4) = (int)puVar28;
      *(int *)((long)local_450.super_QVLABaseBase.ptr + lVar18 * 4 + 8) = (int)lVar19;
      uVar5 = QMetaStringTable::enter(&local_4b8);
      *(undefined4 *)((long)local_450.super_QVLABaseBase.ptr + lVar18 * 4 + 0xc) = uVar5;
      *(undefined4 *)((long)local_450.super_QVLABaseBase.ptr + lVar18 * 4 + 0x10) =
           *(undefined4 *)&p_Var10[7]._M_parent;
      *(int *)((long)local_450.super_QVLABaseBase.ptr + lVar18 * 4 + 0x14) = (int)local_530;
      if (-1 < (long)puVar28) {
        lVar21 = -1;
        do {
          local_4d8.d.d = (Data *)0x0;
          local_4d8.d.ptr = (char16_t *)0x0;
          local_4d8.d.size = 0;
          if (lVar21 < 0) {
            if (p_Var10[5]._M_left == (_Base_ptr)0x0) {
              _Var6 = 0x2b;
            }
            else {
              _Var6 = (p_Var10[5]._M_right)->_M_color;
              if (_Var6 == ~_S_red) {
                _Var6 = QMetaStringTable::enter(&local_4b8);
                _Var6 = _Var6 | 0x80000000;
              }
            }
          }
          else if (lVar21 < (long)p_Var10[4]._M_parent) {
            _Var6 = (&(p_Var10[4]._M_left)->_M_color)[lVar21];
          }
          else {
            QMetaType::QMetaType
                      (&local_4e0,
                       *(int *)((long)p_Var10[5]._M_right +
                               lVar21 * 4 + (long)p_Var10[4]._M_parent * -4 + 4));
            if (local_4e0.d_ptr == (QMetaTypeInterface *)0x0) {
              pcVar25 = (char *)0x0;
            }
            else {
              pcVar25 = (local_4e0.d_ptr)->name;
            }
            QByteArray::operator=((QByteArray *)&local_4d8,pcVar25);
            QByteArray::append((char)&local_4d8);
            _Var6 = _S_red;
          }
          _Var7 = _Var6;
          if (local_4d8.d.size != 0) {
            _Var7 = QMetaStringTable::enter(&local_4b8);
            _Var7 = _Var7 | 0x80000000;
          }
          QMetaType::QMetaType(&local_4e0,_Var6);
          *(QMetaTypeInterface **)((long)__s + lVar21 * 8 + local_530 * 8 + 8) = local_4e0.d_ptr;
          *(_Rb_tree_color *)((long)local_450.super_QVLABaseBase.ptr + lVar21 * 4 + lVar19 * 4 + 4)
               = _Var7;
          if (&(local_4d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_4d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_4d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_4d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_4d8.d.d)->super_QArrayData,1,0x10);
            }
          }
          lVar11 = lVar21 - ((long)&p_Var29->_M_color + (long)&p_Var15->_M_color);
          lVar21 = lVar21 + 1;
        } while (lVar11 != -2);
        lVar19 = lVar19 + lVar21 + 1;
        local_530 = local_530 + lVar21 + 1;
      }
      if (0 < (long)puVar28) {
        do {
          uVar5 = QMetaStringTable::enter(&local_4b8);
          *(undefined4 *)((long)local_450.super_QVLABaseBase.ptr + lVar19 * 4) = uVar5;
          lVar19 = lVar19 + 1;
          puVar28 = puVar28 + -1;
        } while (puVar28 != (undefined1 *)0x0);
      }
      lVar18 = lVar18 + 6;
      *(int *)((long)local_450.super_QVLABaseBase.ptr + local_520 * 4) = (int)local_528;
      p_Var15 = p_Var10[4]._M_parent;
      puVar1 = (undefined4 *)((long)local_450.super_QVLABaseBase.ptr + local_528 * 4);
      *puVar1 = (int)p_Var15;
      memcpy(puVar1 + 1,p_Var10[4]._M_left,(long)p_Var15 << 2);
      p_Var15 = p_Var10[4]._M_parent;
      lVar21 = (long)&p_Var15->_M_color + local_528 + 1;
      *(int *)((long)local_450.super_QVLABaseBase.ptr + local_520 * 4 + 4) = (int)lVar21;
      local_520 = local_520 + 2;
      p_Var29 = p_Var10[5]._M_left;
      puVar1 = (undefined4 *)((long)local_450.super_QVLABaseBase.ptr + lVar21 * 4);
      *puVar1 = (int)p_Var29;
      memcpy(puVar1 + 1,p_Var10[5]._M_right,(long)p_Var29 << 2);
      local_528 = (long)&(p_Var10[5]._M_left)->_M_color + (long)&p_Var15->_M_color + local_528 + 2;
    }
    lVar27 = lVar27 + 8;
  } while (lVar27 != 0x10);
  pQVar4 = (this->properties).d.d.ptr;
  if (pQVar4 == (QMapData<std::map<QByteArray,_QDBusMetaObjectGenerator::Property,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QDBusMetaObjectGenerator::Property>_>_>_>
                 *)0x0) {
    p_Var10 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var10 = *(_Base_ptr *)((long)&(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10)
    ;
  }
  p_Var20 = &(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar4 == (QMapData<std::map<QByteArray,_QDBusMetaObjectGenerator::Property,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QDBusMetaObjectGenerator::Property>_>_>_>
                 *)0x0) {
    p_Var20 = (_Rb_tree_node_base *)0x0;
  }
  if (p_Var10 == p_Var20) {
    uVar26 = 0;
  }
  else {
    iVar16 = *(int *)((long)pvVar12 + 0x38);
    lVar22 = (lVar18 + lVar22) * 4 + 0x10;
    uVar26 = 0;
    do {
      uVar5 = QMetaStringTable::enter(&local_4b8);
      *(undefined4 *)((long)local_450.super_QVLABaseBase.ptr + lVar22 + -0x10) = uVar5;
      *(undefined4 *)((long)local_450.super_QVLABaseBase.ptr + lVar22 + -0xc) =
           *(undefined4 *)&p_Var10[3]._M_parent;
      *(undefined4 *)((long)local_450.super_QVLABaseBase.ptr + lVar22 + -8) =
           *(undefined4 *)((long)&p_Var10[3]._M_parent + 4);
      *(undefined8 *)((long)local_450.super_QVLABaseBase.ptr + lVar22 + -4) = 0xffffffff;
      uVar5 = QMetaStringTable::enter(&local_4b8);
      *(undefined4 *)((long)local_450.super_QVLABaseBase.ptr + uVar26 * 8 + (long)iVar16 * 4) =
           uVar5;
      *(undefined4 *)((long)local_450.super_QVLABaseBase.ptr + uVar26 * 8 + (long)iVar16 * 4 + 4) =
           *(undefined4 *)&p_Var10[3]._M_parent;
      QMetaType::QMetaType((QMetaType *)&local_4d8,*(int *)&p_Var10[3]._M_parent);
      *(Data **)((long)__s + uVar26 * 8) = local_4d8.d.d;
      uVar26 = uVar26 + 1;
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      lVar22 = lVar22 + 0x14;
    } while (p_Var10 != p_Var20);
    uVar26 = uVar26 & 0xffffffff;
  }
  *(undefined8 *)((long)__s + uVar26 * 8) = 0;
  iVar16 = QMetaStringTable::blobSize();
  pvVar12 = operator_new__((long)iVar16);
  QMetaStringTable::writeBlob((char *)&local_4b8);
  __n_00 = local_450.super_QVLABaseBase.s * 4;
  uVar26 = 0xffffffffffffffff;
  if ((ulong)local_450.super_QVLABaseBase.s < 0x4000000000000000) {
    uVar26 = __n_00;
  }
  __dest = operator_new__(uVar26);
  memcpy(__dest,local_450.super_QVLABaseBase.ptr,__n_00);
  puVar24[2] = __dest;
  puVar24[6] = 0;
  puVar24[3] = 0;
  puVar24[4] = 0;
  puVar24[1] = pvVar12;
  *puVar24 = &QDBusAbstractInterface::staticMetaObject;
  puVar24[5] = __s;
  if ((QArrayData *)local_4b8.d.size != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_4b8.d.size)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_4b8.d.size)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_4b8.d.size)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_4b8.d.size,1,0x10);
    }
  }
  QHash<QByteArray,_int>::~QHash((QHash<QByteArray,_int> *)&local_4b8);
  if ((undefined8 *)local_450.super_QVLABaseBase.ptr != local_438) {
    QtPrivate::sizedFree(local_450.super_QVLABaseBase.ptr,local_450.super_QVLABaseBase.a << 2);
  }
  if (&(local_488.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_488.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_488.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_488.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_488.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QDBusMetaObjectGenerator::write(QDBusMetaObject *obj)
{
    // this code here is mostly copied from qaxbase.cpp
    // with a few modifications to make it cleaner

    QString className = interface;
    className.replace(u'.', "::"_L1);
    if (className.isEmpty())
        className = "QDBusInterface"_L1;

    QVarLengthArray<uint> idata;
    idata.resize(sizeof(QDBusMetaObjectPrivate) / sizeof(uint));

    qsizetype methodParametersDataSize =
            ((aggregateParameterCount(signals_)
             + aggregateParameterCount(methods)) * 2) // types and parameter names
            - signals_.size() // return "parameters" don't have names
            - methods.size(); // ditto

    QDBusMetaObjectPrivate *header = reinterpret_cast<QDBusMetaObjectPrivate *>(idata.data());
    static_assert(QMetaObjectPrivate::OutputRevision == 13, "QtDBus meta-object generator should generate the same version as moc");
    header->revision = QMetaObjectPrivate::OutputRevision;
    header->className = 0;
    header->classInfoCount = 0;
    header->classInfoData = 0;
    header->methodCount = int(signals_.size() + methods.size());
    header->methodData = int(idata.size());
    header->propertyCount = int(properties.size());
    header->propertyData = int(header->methodData + header->methodCount *
                               QMetaObjectPrivate::IntsPerMethod + methodParametersDataSize);
    header->enumeratorCount = 0;
    header->enumeratorData = 0;
    header->constructorCount = 0;
    header->constructorData = 0;
    header->flags = RequiresVariantMetaObject | AllocatedMetaObject;
    header->signalCount = signals_.size();
    // These are specific to QDBusMetaObject:
    header->propertyDBusData = int(header->propertyData + header->propertyCount
                                   * QMetaObjectPrivate::IntsPerProperty);
    header->methodDBusData = int(header->propertyDBusData + header->propertyCount * intsPerProperty);

    qsizetype data_size = idata.size() +
                    (header->methodCount * (QMetaObjectPrivate::IntsPerMethod+intsPerMethod)) + methodParametersDataSize +
                    (header->propertyCount * (QMetaObjectPrivate::IntsPerProperty+intsPerProperty));

    // Signals must be added before other methods, to match moc.
    std::array<std::reference_wrapper<const MethodMap>, 2> methodMaps = { signals_, methods };

    for (const auto &methodMap : methodMaps) {
        for (const Method &mm : methodMap.get())
            data_size += 2 + mm.inputTypes.size() + mm.outputTypes.size();
    }
    idata.resize(data_size + 1);

    QMetaStringTable strings(className.toLatin1());

    qsizetype offset = header->methodData;
    qsizetype parametersOffset = offset + header->methodCount * QMetaObjectPrivate::IntsPerMethod;
    qsizetype signatureOffset = header->methodDBusData;
    qsizetype typeidOffset = header->methodDBusData + header->methodCount * intsPerMethod;
    idata[typeidOffset++] = 0;                           // eod

    qsizetype totalMetaTypeCount = properties.size();
    ++totalMetaTypeCount; // + 1 for metatype of dynamic metaobject
    for (const auto &methodMap : methodMaps) {
        for (const Method &mm : methodMap.get()) {
            qsizetype argc = mm.inputTypes.size() + qMax(qsizetype(0), mm.outputTypes.size() - 1);
            totalMetaTypeCount += argc + 1;
        }
    }
    QMetaType *metaTypes = new QMetaType[totalMetaTypeCount];
    int propertyId = 0;

    // add each method:
    qsizetype currentMethodMetaTypeOffset = properties.size() + 1;

    for (const auto &methodMap : methodMaps) {
        for (const Method &mm : methodMap.get()) {
            qsizetype argc = mm.inputTypes.size() + qMax(qsizetype(0), mm.outputTypes.size() - 1);

            idata[offset++] = strings.enter(mm.name);
            idata[offset++] = argc;
            idata[offset++] = parametersOffset;
            idata[offset++] = strings.enter(mm.tag);
            idata[offset++] = mm.flags;
            idata[offset++] = currentMethodMetaTypeOffset;

            // Parameter types
            for (qsizetype i = -1; i < argc; ++i) {
                int type;
                QByteArray typeName;
                if (i < 0) { // Return type
                    if (!mm.outputTypes.isEmpty()) {
                        type = mm.outputTypes.first();
                        if (type == -1) {
                            type = IsUnresolvedType | strings.enter(mm.rawReturnType);
                        }
                    } else {
                        type = QMetaType::Void;
                    }
                } else if (i < mm.inputTypes.size()) {
                    type = mm.inputTypes.at(i);
                } else {
                    Q_ASSERT(mm.outputTypes.size() > 1);
                    type = mm.outputTypes.at(i - mm.inputTypes.size() + 1);
                    // Output parameters are references; type id not available
                    typeName = QMetaType(type).name();
                    typeName.append('&');
                    type = QMetaType::UnknownType;
                }
                int typeInfo;
                if (!typeName.isEmpty())
                    typeInfo = IsUnresolvedType | strings.enter(typeName);
                else
                    typeInfo = type;
                metaTypes[currentMethodMetaTypeOffset++] = QMetaType(type);
                idata[parametersOffset++] = typeInfo;
            }
            // Parameter names
            for (qsizetype i = 0; i < argc; ++i)
                idata[parametersOffset++] = strings.enter(mm.parameterNames.at(i));

            idata[signatureOffset++] = typeidOffset;
            idata[typeidOffset++] = mm.inputTypes.size();
            memcpy(idata.data() + typeidOffset, mm.inputTypes.data(), mm.inputTypes.size() * sizeof(uint));
            typeidOffset += mm.inputTypes.size();

            idata[signatureOffset++] = typeidOffset;
            idata[typeidOffset++] = mm.outputTypes.size();
            memcpy(idata.data() + typeidOffset, mm.outputTypes.data(), mm.outputTypes.size() * sizeof(uint));
            typeidOffset += mm.outputTypes.size();
        }
    }

    Q_ASSERT(offset == header->methodData + header->methodCount * QMetaObjectPrivate::IntsPerMethod);
    Q_ASSERT(parametersOffset == header->propertyData);
    Q_ASSERT(signatureOffset == header->methodDBusData + header->methodCount * intsPerMethod);
    Q_ASSERT(typeidOffset == idata.size());
    offset += methodParametersDataSize;
    Q_ASSERT(offset == header->propertyData);

    // add each property
    signatureOffset = header->propertyDBusData;
    for (const auto &[name, mp] : std::as_const(properties).asKeyValueRange()) {
        // form is name, typeinfo, flags
        idata[offset++] = strings.enter(name);
        Q_ASSERT(mp.type != QMetaType::UnknownType);
        idata[offset++] = mp.type;
        idata[offset++] = mp.flags;
        idata[offset++] = -1; // notify index
        idata[offset++] = 0; // revision

        idata[signatureOffset++] = strings.enter(mp.signature);
        idata[signatureOffset++] = mp.type;

        metaTypes[propertyId++] = QMetaType(mp.type);
    }
    metaTypes[propertyId] = QMetaType(); // we can't know our own metatype

    Q_ASSERT(offset == header->propertyDBusData);
    Q_ASSERT(signatureOffset == header->methodDBusData);

    char *string_data = new char[strings.blobSize()];
    strings.writeBlob(string_data);

    uint *uint_data = new uint[idata.size()];
    memcpy(uint_data, idata.data(), idata.size() * sizeof(uint));

    // put the metaobject together
    obj->d.data = uint_data;
    obj->d.relatedMetaObjects = nullptr;
    obj->d.static_metacall = nullptr;
    obj->d.extradata = nullptr;
    obj->d.stringdata = reinterpret_cast<const uint *>(string_data);
    obj->d.superdata = &QDBusAbstractInterface::staticMetaObject;
    obj->d.metaTypes = reinterpret_cast<QtPrivate::QMetaTypeInterface *const *>(metaTypes);
}